

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O1

void list(archive *a,archive_entry *e)

{
  int iVar1;
  tm *__tp;
  tm *ptVar2;
  la_int64_t lVar3;
  la_int64_t lVar4;
  size_t sVar5;
  tm *__s;
  tm *ptVar6;
  char *pcVar7;
  char *__format;
  undefined8 in_R8;
  tm *in_R9;
  char buf [20];
  time_t mtime;
  undefined8 uStack_130;
  undefined1 *puStack_128;
  undefined1 *puStack_120;
  undefined1 auStack_110 [8];
  char *pcStack_108;
  tm *ptStack_f8;
  undefined8 uStack_f0;
  tm *ptStack_e8;
  archive *paStack_58;
  archive_entry *paStack_50;
  char acStack_48 [8];
  undefined1 auStack_40 [24];
  time_t local_28;
  
  ptVar6 = (tm *)acStack_48;
  paStack_50 = (archive_entry *)0x104da0;
  local_28 = archive_entry_mtime(e);
  paStack_50 = (archive_entry *)0x104dad;
  __tp = localtime(&local_28);
  pcVar7 = "%m-%d-%G %R";
  if (*y_str == '\0') {
    pcVar7 = "%m-%d-%g %R";
  }
  paStack_50 = (archive_entry *)0x104dd9;
  strftime(acStack_48,0x14,pcVar7,__tp);
  paStack_50 = (archive_entry *)0x104de1;
  ptVar2 = (tm *)archive_entry_pathname(e);
  __s = (tm *)0x116b32;
  if (ptVar2 != (tm *)0x0) {
    __s = ptVar2;
  }
  if (zipinfo_mode == '\0') {
    if (v_opt == 2) {
      paStack_50 = (archive_entry *)0x104e44;
      lVar3 = archive_entry_size(e);
      paStack_50 = (archive_entry *)0x104e4f;
      lVar4 = archive_entry_size(e);
      in_R8 = 0;
      paStack_50 = (archive_entry *)0x104e6c;
      printf("%8ju  Stored  %7ju   0%%  %s  %08x  %s\n",lVar3,lVar4);
      in_R9 = __s;
    }
    else {
      ptVar6 = __tp;
      if (v_opt == 1) {
        paStack_50 = (archive_entry *)0x104e23;
        lVar3 = archive_entry_size(e);
        paStack_50 = (archive_entry *)0x104e3a;
        printf(" %8ju  %s   %s\n",lVar3,acStack_48);
        ptVar6 = __s;
      }
    }
  }
  else {
    ptVar6 = __tp;
    if (Z1_opt == '\x01') {
      paStack_50 = (archive_entry *)0x104e09;
      puts((char *)__s);
      ptVar6 = __tp;
    }
  }
  paStack_50 = (archive_entry *)0x104e74;
  iVar1 = archive_read_data_skip(a);
  if (iVar1 == 0) {
    return;
  }
  paStack_50 = (archive_entry *)0x104e8c;
  pcVar7 = archive_error_string(a);
  __format = "%s";
  paStack_50 = (archive_entry *)info;
  errorx("%s");
  if ((q_opt != '\x01') || ((unzip_debug & 1) != 0)) {
    puStack_120 = auStack_110;
    puStack_128 = auStack_40;
    uStack_130 = 0x3000000008;
    pcStack_108 = pcVar7;
    ptStack_f8 = ptVar6;
    uStack_f0 = in_R8;
    ptStack_e8 = in_R9;
    paStack_58 = a;
    paStack_50 = e;
    vfprintf(_stdout,__format,&uStack_130);
    fflush(_stdout);
    if (*__format == '\0') {
      noeol = 1;
    }
    else {
      sVar5 = strlen(__format);
      noeol = (int)(__format[sVar5 - 1] != '\n');
    }
  }
  return;
}

Assistant:

static void
list(struct archive *a, struct archive_entry *e)
{
	char buf[20];
	time_t mtime;
	struct tm *tm;
	const char *pathname;

	mtime = archive_entry_mtime(e);
	tm = localtime(&mtime);
	if (*y_str)
		strftime(buf, sizeof(buf), "%m-%d-%G %R", tm);
	else
		strftime(buf, sizeof(buf), "%m-%d-%g %R", tm);

	pathname = archive_entry_pathname(e);
	if (!pathname)
		pathname = "";
	if (!zipinfo_mode) {
		if (v_opt == 1) {
			printf(" %8ju  %s   %s\n",
			    (uintmax_t)archive_entry_size(e),
			    buf, pathname);
		} else if (v_opt == 2) {
			printf("%8ju  Stored  %7ju   0%%  %s  %08x  %s\n",
			    (uintmax_t)archive_entry_size(e),
			    (uintmax_t)archive_entry_size(e),
			    buf,
			    0U,
			    pathname);
		}
	} else {
		if (Z1_opt)
			printf("%s\n", pathname);
	}
	ac(archive_read_data_skip(a));
}